

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  char *pcVar1;
  int iVar2;
  TValue *io2;
  TValue *io1;
  int compatible_1;
  StkId input;
  TString *pTStack_40;
  int compatible;
  TString *usertype;
  char *pcStack_30;
  ravi_type_map type;
  char *name;
  StkId pos;
  lua_Debug *plStack_18;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  name = (char *)0x0;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  pos._4_4_ = n;
  plStack_18 = ar;
  ar_local = (lua_Debug *)L;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xd4,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
  }
  swapextra(L);
  pcStack_30 = findlocal((lua_State *)ar_local,plStack_18->i_ci,pos._4_4_,(StkId *)&name,
                         (ravi_type_map *)((long)&usertype + 4),&stack0xffffffffffffffc0);
  if (pcStack_30 != (char *)0x0) {
    iVar2 = raviV_checktype((lua_State *)ar_local,(TValue *)(ar_local->namewhat + -0x10),
                            usertype._4_4_,pTStack_40);
    if (iVar2 == 0) {
      pcStack_30 = (char *)0x0;
    }
    else {
      pcVar1 = ar_local->namewhat;
      *(undefined8 *)name = *(undefined8 *)(pcVar1 + -0x10);
      *(undefined2 *)(name + 8) = *(undefined2 *)(pcVar1 + -8);
      if ((*(ushort *)(name + 8) & 0x8000) != 0) {
        if ((*(ushort *)(name + 8) & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0xdf,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
        }
        if ((*(ushort *)(name + 8) & 0x7f) != (ushort)*(byte *)(*(long *)name + 8)) {
LAB_0013824e:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0xdf,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
        }
        if (ar_local != (lua_Debug *)0x0) {
          if ((*(ushort *)(name + 8) & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                          ,0xdf,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
          }
          if ((*(byte *)(*(long *)name + 9) & (ar_local->what[0x54] ^ 0x18U)) != 0)
          goto LAB_0013824e;
        }
      }
      ar_local->namewhat = ar_local->namewhat + -0x10;
    }
  }
  swapextra((lua_State *)ar_local);
  iVar2 = *(int *)&(ar_local[-1].i_ci)->func + -1;
  *(int *)&(ar_local[-1].i_ci)->func = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xe6,"const char *lua_setlocal(lua_State *, const lua_Debug *, int)");
  }
  return pcStack_30;
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  StkId pos = NULL;  /* to avoid warnings */
  const char *name;
  ravi_type_map type;
  TString* usertype;
  int compatible = 1;
  lua_lock(L);
  swapextra(L);
  name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
  if (name) {
    /* RAVI extension
    ** We need to ensure that this function does
    ** not subvert the types of local variables
    */
    StkId input = L->top - 1;
    int compatible = raviV_checktype(L, input, type, usertype);
    if (compatible) {
      setobjs2s(L, pos, L->top - 1);
      L->top--;  /* pop value */
    }
    else
      name = NULL;
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}